

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O0

int Dsd_TreeCountPrimeNodes(Dsd_Manager_t *pDsdMan)

{
  int iVar1;
  int local_18;
  int local_14;
  int i;
  int Counter;
  Dsd_Manager_t *pDsdMan_local;
  
  local_14 = 0;
  for (local_18 = 0; local_18 < pDsdMan->nRoots; local_18 = local_18 + 1) {
    iVar1 = Dsd_TreeCountPrimeNodes_rec
                      ((Dsd_Node_t *)((ulong)pDsdMan->pRoots[local_18] & 0xfffffffffffffffe));
    local_14 = iVar1 + local_14;
  }
  Dsd_TreeUnmark(pDsdMan);
  return local_14;
}

Assistant:

int Dsd_TreeCountPrimeNodes( Dsd_Manager_t * pDsdMan )
{
    int Counter, i;
    Counter = 0;
    for ( i = 0; i < pDsdMan->nRoots; i++ )
        Counter += Dsd_TreeCountPrimeNodes_rec( Dsd_Regular( pDsdMan->pRoots[i] ) );
    Dsd_TreeUnmark( pDsdMan );
    return Counter;
}